

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

PCRE2_SPTR16
compile_ref_iterator_matchingpath(compiler_common *common,PCRE2_SPTR16 cc,backtrack_common *parent)

{
  jump_list **ppjVar1;
  PCRE2_UCHAR16 PVar2;
  ushort uVar3;
  int iVar4;
  sljit_compiler *psVar5;
  sljit_compiler *psVar6;
  uint uVar7;
  backtrack_common *pbVar8;
  ulong uVar9;
  sljit_jump *psVar10;
  stub_list *psVar11;
  sljit_label *psVar12;
  sljit_u8 *psVar13;
  sljit_jump *psVar14;
  sljit_jump *psVar15;
  sljit_label *psVar16;
  backtrack_common *pbVar17;
  jump_list *pjVar18;
  ushort *puVar19;
  ushort uVar20;
  uint uVar21;
  ulong src2w;
  uint uVar22;
  sljit_s32 sVar23;
  sljit_sw sVar24;
  
  psVar5 = common->compiler;
  PVar2 = *cc;
  if (psVar5->error == 0) {
    pbVar8 = (backtrack_common *)ensure_abuf(psVar5,0x30);
  }
  else {
    pbVar8 = (backtrack_common *)0x0;
  }
  uVar21 = 0;
  if (psVar5->error == 0) {
    pbVar8->cc = (PCRE2_SPTR16)0x0;
    pbVar8[1].prev = (backtrack_common *)0x0;
    pbVar8->top = (backtrack_common *)0x0;
    pbVar8->topbacktracks = (jump_list *)0x0;
    pbVar8->prev = (backtrack_common *)0x0;
    pbVar8->nextbacktracks = (jump_list *)0x0;
    pbVar8->prev = parent->top;
    pbVar8->cc = cc;
    parent->top = pbVar8;
    uVar20 = PVar2 - 0x71;
    puVar19 = cc + 1;
    if (uVar20 < 2) {
      uVar21 = (uint)cc[1] * 2;
      puVar19 = cc;
    }
    uVar3 = puVar19[2];
    uVar22 = 0;
    uVar7 = 0;
    switch(uVar3) {
    case 100:
    case 0x65:
      puVar19 = puVar19 + 3;
      src2w = 1;
      break;
    case 0x66:
    case 0x67:
      uVar7 = 1;
    case 0x62:
    case 99:
      uVar22 = uVar7;
      puVar19 = puVar19 + 3;
    default:
      src2w = 0;
      break;
    case 0x68:
    case 0x69:
      src2w = (ulong)puVar19[3];
      uVar22 = (uint)puVar19[4];
      puVar19 = puVar19 + 5;
    }
    uVar9 = (ulong)uVar21;
    uVar21 = (uint)src2w;
    if ((uVar3 & 1) == 0) {
      psVar6 = common->compiler;
      psVar11 = (stub_list *)0x0;
      if (uVar21 == 0) {
        sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,0x10);
        psVar10 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
        psVar6 = common->compiler;
        if (psVar6->error == 0) {
          psVar11 = (stub_list *)ensure_abuf(psVar6,0x18);
        }
        if (psVar11 != (stub_list *)0x0) {
          psVar11->start = psVar10;
          psVar12 = sljit_emit_label(psVar6);
          psVar11->quit = psVar12;
          psVar11->next = common->stubs;
          common->stubs = psVar11;
        }
        if ((uVar20 < 2) && (psVar5->error == 0)) {
          iVar4 = common->ovector_start;
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar4 + uVar9 * 8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,0x40,0,0x8c,8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 199;
          }
        }
        sljit_emit_op2(psVar5,0x60,0xc,0,0xc,0,0x40,8);
        if (uVar20 < 2) {
          sVar24 = (long)common->ovector_start + uVar9 * 8 + 8;
          sVar23 = 0x8e;
        }
        else {
          compile_dnref_search(common,cc,(jump_list **)0x0);
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,1,0,0x84,0);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8e,0x18);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x89;
            }
          }
          sVar24 = 8;
          sVar23 = 0x84;
        }
        psVar10 = sljit_emit_cmp(psVar5,0,1,0,sVar23,sVar24);
        sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,8);
      }
      else {
        sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,8);
        psVar10 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
        psVar6 = common->compiler;
        if (psVar6->error == 0) {
          psVar11 = (stub_list *)ensure_abuf(psVar6,0x18);
        }
        if (psVar11 != (stub_list *)0x0) {
          psVar11->start = psVar10;
          psVar12 = sljit_emit_label(psVar6);
          psVar11->quit = psVar12;
          psVar11->next = common->stubs;
          common->stubs = psVar11;
        }
        if ((uVar20 < 2) && (psVar5->error == 0)) {
          iVar4 = common->ovector_start;
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar4 + uVar9 * 8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,0x40,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 199;
          }
        }
        ppjVar1 = &pbVar8->topbacktracks;
        if (uVar20 < 2) {
          pjVar18 = (jump_list *)0x0;
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x8e,(long)common->ovector_start + 8);
          if (psVar5->error == 0) {
            pjVar18 = (jump_list *)ensure_abuf(psVar5,0x10);
          }
          if (pjVar18 != (jump_list *)0x0) {
            pjVar18->next = *ppjVar1;
            pjVar18->jump = psVar10;
            *ppjVar1 = pjVar18;
          }
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x8e,(long)common->ovector_start + uVar9 * 8 + 8);
        }
        else {
          compile_dnref_search(common,cc,ppjVar1);
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,1,0,0x84,0);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8e,0x18);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x89;
            }
          }
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x84,8);
        }
      }
      if ((1 < uVar22 || 1 < uVar21) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,0x40,0,0x8e,0x10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      psVar12 = sljit_emit_label(psVar5);
      if ((1 < uVar20) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8e,0x18);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      compile_ref_matchingpath(common,cc,&pbVar8->topbacktracks,0,0);
      if (1 < uVar22 || 1 < uVar21) {
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8e,0x10);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        sljit_emit_op2(psVar5,0x60,1,0,1,0,0x40,1);
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8e,0x10);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        if (((1 < uVar21) &&
            (psVar14 = sljit_emit_cmp(psVar5,2,1,0,0x40,src2w), psVar12 != (sljit_label *)0x0)) &&
           (psVar14 != (sljit_jump *)0x0)) {
          psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
          (psVar14->u).label = psVar12;
        }
        if (1 < uVar22) {
          psVar11 = (stub_list *)0x0;
          psVar14 = sljit_emit_cmp(psVar5,3,1,0,0x40,(ulong)uVar22);
          psVar6 = common->compiler;
          sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,8);
          psVar15 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
          psVar6 = common->compiler;
          if (psVar6->error == 0) {
            psVar11 = (stub_list *)ensure_abuf(psVar6,0x18);
          }
          if (psVar11 != (stub_list *)0x0) {
            psVar11->start = psVar15;
            psVar16 = sljit_emit_label(psVar6);
            psVar11->quit = psVar16;
            psVar11->next = common->stubs;
            common->stubs = psVar11;
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x89;
            }
          }
          psVar15 = sljit_emit_jump(psVar5,0x18);
          if ((psVar12 != (sljit_label *)0x0) && (psVar15 != (sljit_jump *)0x0)) {
            psVar15->flags = (psVar15->flags & 0xfffffffffffffffcU) + 1;
            (psVar15->u).label = psVar12;
          }
          psVar16 = sljit_emit_label(psVar5);
          if ((psVar14 != (sljit_jump *)0x0) && (psVar16 != (sljit_label *)0x0)) {
            psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
            (psVar14->u).label = psVar16;
          }
        }
      }
      if (uVar22 == 0) {
        psVar6 = common->compiler;
        psVar11 = (stub_list *)0x0;
        sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,8);
        psVar14 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
        psVar6 = common->compiler;
        if (psVar6->error == 0) {
          psVar11 = (stub_list *)ensure_abuf(psVar6,0x18);
        }
        if (psVar11 != (stub_list *)0x0) {
          psVar11->start = psVar14;
          psVar16 = sljit_emit_label(psVar6);
          psVar11->quit = psVar16;
          psVar11->next = common->stubs;
          common->stubs = psVar11;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        psVar14 = sljit_emit_jump(psVar5,0x18);
        if ((psVar12 != (sljit_label *)0x0) && (psVar14 != (sljit_jump *)0x0)) {
          psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
          (psVar14->u).label = psVar12;
        }
      }
      psVar12 = sljit_emit_label(psVar5);
      if ((psVar10 != (sljit_jump *)0x0) && (psVar12 != (sljit_label *)0x0)) {
        psVar10->flags = (psVar10->flags & 0xfffffffffffffffcU) + 1;
        (psVar10->u).label = psVar12;
      }
      pbVar17 = (backtrack_common *)sljit_emit_label(psVar5);
      pbVar8[1].prev = pbVar17;
    }
    else {
      psVar6 = common->compiler;
      psVar11 = (stub_list *)0x0;
      sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,(ulong)(1 < (ushort)(PVar2 - 0x71)) * 8 + 0x10);
      psVar10 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
      psVar6 = common->compiler;
      if (psVar6->error == 0) {
        psVar11 = (stub_list *)ensure_abuf(psVar6,0x18);
      }
      if (psVar11 != (stub_list *)0x0) {
        psVar11->start = psVar10;
        psVar12 = sljit_emit_label(psVar6);
        psVar11->quit = psVar12;
        psVar11->next = common->stubs;
        common->stubs = psVar11;
      }
      if ((uVar20 < 2) && (psVar5->error == 0)) {
        iVar4 = common->ovector_start;
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar4 + uVar9 * 8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,0x40,0,0x8c,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if ((uVar3 != 99) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,0x40,0,0x8c,8);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 199;
        }
      }
      if (uVar21 == 0) {
        if (uVar20 < 2) {
          sVar24 = (long)common->ovector_start + uVar9 * 8 + 8;
          sVar23 = 0x8e;
        }
        else {
          compile_dnref_search(common,cc,(jump_list **)0x0);
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,1,0,0x84,0);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8c,0x10);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x89;
            }
          }
          sVar24 = 8;
          sVar23 = 0x84;
        }
        psVar10 = sljit_emit_cmp(psVar5,0,1,0,sVar23,sVar24);
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        psVar14 = sljit_emit_jump(psVar5,0x18);
      }
      else {
        ppjVar1 = &pbVar8->topbacktracks;
        if (uVar20 < 2) {
          pjVar18 = (jump_list *)0x0;
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x8e,(long)common->ovector_start + 8);
          if (psVar5->error == 0) {
            pjVar18 = (jump_list *)ensure_abuf(psVar5,0x10);
          }
          if (pjVar18 != (jump_list *)0x0) {
            pjVar18->next = *ppjVar1;
            pjVar18->jump = psVar10;
            *ppjVar1 = pjVar18;
          }
          psVar14 = (sljit_jump *)0x0;
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x8e,(long)common->ovector_start + uVar9 * 8 + 8);
        }
        else {
          compile_dnref_search(common,cc,ppjVar1);
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,1,0,0x84,0);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x8b;
            }
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8c,0x10);
            if (psVar13 != (sljit_u8 *)0x0) {
              *psVar13 = 0x89;
            }
          }
          psVar14 = (sljit_jump *)0x0;
          psVar10 = sljit_emit_cmp(psVar5,0,1,0,0x84,8);
        }
      }
      pbVar17 = (backtrack_common *)sljit_emit_label(psVar5);
      pbVar8[1].prev = pbVar17;
      if (uVar22 != 0) {
        psVar15 = sljit_emit_cmp(psVar5,3,0x8c,8,0x40,(ulong)uVar22);
        if (psVar5->error == 0) {
          pjVar18 = (jump_list *)ensure_abuf(psVar5,0x10);
        }
        else {
          pjVar18 = (jump_list *)0x0;
        }
        if (pjVar18 != (jump_list *)0x0) {
          pjVar18->next = pbVar8->topbacktracks;
          pjVar18->jump = psVar15;
          pbVar8->topbacktracks = pjVar18;
        }
      }
      if ((1 < uVar20) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,4,0,0x8c,0x10);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x8b;
        }
      }
      compile_ref_matchingpath(common,cc,&pbVar8->topbacktracks,1,1);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar13 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
        if (psVar13 != (sljit_u8 *)0x0) {
          *psVar13 = 0x89;
        }
      }
      if (uVar21 < 2) {
        if (uVar22 != 0) {
          sljit_emit_op2(psVar5,0x60,0x8c,8,0x8c,8,0x40,1);
        }
      }
      else {
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8c,8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x8b;
          }
        }
        sljit_emit_op2(psVar5,0x60,1,0,1,0,0x40,1);
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar13 = emit_x86_instruction(psVar5,1,1,0,0x8c,8);
          if (psVar13 != (sljit_u8 *)0x0) {
            *psVar13 = 0x89;
          }
        }
        psVar15 = sljit_emit_cmp(psVar5,2,1,0,0x40,src2w);
        if ((psVar15 != (sljit_jump *)0x0) &&
           (pbVar8 = pbVar8[1].prev, pbVar8 != (backtrack_common *)0x0)) {
          psVar15->flags = (psVar15->flags & 0xfffffffffffffffcU) + 1;
          (psVar15->u).target = (sljit_uw)pbVar8;
        }
      }
      if ((psVar14 != (sljit_jump *)0x0) &&
         (psVar12 = sljit_emit_label(psVar5), psVar12 != (sljit_label *)0x0)) {
        psVar14->flags = (psVar14->flags & 0xfffffffffffffffcU) + 1;
        (psVar14->u).label = psVar12;
      }
      psVar12 = sljit_emit_label(psVar5);
      if ((psVar10 != (sljit_jump *)0x0) && (psVar12 != (sljit_label *)0x0)) {
        psVar10->flags = (psVar10->flags & 0xfffffffffffffffcU) + 1;
        (psVar10->u).label = psVar12;
      }
    }
    psVar5 = common->compiler;
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar13 = emit_x86_instruction(psVar5,0x11,0x40,1,10,0);
      if (psVar13 != (sljit_u8 *)0x0) {
        psVar13[1] = psVar13[1] | 0x28;
      }
    }
    pjVar18 = (jump_list *)0x0;
    psVar10 = sljit_emit_jump(psVar5,0);
    if (psVar5->error == 0) {
      pjVar18 = (jump_list *)ensure_abuf(psVar5,0x10);
    }
    if (pjVar18 != (jump_list *)0x0) {
      pjVar18->next = common->calllimit;
      pjVar18->jump = psVar10;
      common->calllimit = pjVar18;
    }
  }
  else {
    puVar19 = (PCRE2_SPTR16)0x0;
  }
  return puVar19;
}

Assistant:

static SLJIT_INLINE PCRE2_SPTR compile_ref_iterator_matchingpath(compiler_common *common, PCRE2_SPTR cc, backtrack_common *parent)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
backtrack_common *backtrack;
PCRE2_UCHAR type;
int offset = 0;
struct sljit_label *label;
struct sljit_jump *zerolength;
struct sljit_jump *jump = NULL;
PCRE2_SPTR ccbegin = cc;
int min = 0, max = 0;
BOOL minimize;

PUSH_BACKTRACK(sizeof(ref_iterator_backtrack), cc, NULL);

if (ref)
  offset = GET2(cc, 1) << 1;
else
  cc += IMM2_SIZE;
type = cc[1 + IMM2_SIZE];

SLJIT_COMPILE_ASSERT((OP_CRSTAR & 0x1) == 0, crstar_opcode_must_be_even);
minimize = (type & 0x1) != 0;
switch(type)
  {
  case OP_CRSTAR:
  case OP_CRMINSTAR:
  min = 0;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRPLUS:
  case OP_CRMINPLUS:
  min = 1;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRQUERY:
  case OP_CRMINQUERY:
  min = 0;
  max = 1;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRRANGE:
  case OP_CRMINRANGE:
  min = GET2(cc, 1 + IMM2_SIZE + 1);
  max = GET2(cc, 1 + IMM2_SIZE + 1 + IMM2_SIZE);
  cc += 1 + IMM2_SIZE + 1 + 2 * IMM2_SIZE;
  break;
  default:
  SLJIT_UNREACHABLE();
  break;
  }

if (!minimize)
  {
  if (min == 0)
    {
    allocate_stack(common, 2);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);
    /* Temporary release of STR_PTR. */
    OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    /* Handles both invalid and empty cases. Since the minimum repeat,
    is zero the invalid case is basically the same as an empty case. */
    if (ref)
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    else
      {
      compile_dnref_search(common, ccbegin, NULL);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    /* Restore if not zero length. */
    OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    }
  else
    {
    allocate_stack(common, 1);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    if (ref)
      {
      add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
      }
    else
      {
      compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    }

  if (min > 1 || max > 1)
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, SLJIT_IMM, 0);

  label = LABEL();
  if (!ref)
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1);
  compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, FALSE, FALSE);

  if (min > 1 || max > 1)
    {
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0);
    OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, TMP1, 0);
    if (min > 1)
      CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, label);
    if (max > 1)
      {
      jump = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, max);
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      JUMPTO(SLJIT_JUMP, label);
      JUMPHERE(jump);
      }
    }

  if (max == 0)
    {
    /* Includes min > 1 case as well. */
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    JUMPTO(SLJIT_JUMP, label);
    }

  JUMPHERE(zerolength);
  BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();

  count_match(common);
  return cc;
  }

allocate_stack(common, ref ? 2 : 3);
if (ref)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
if (type != OP_CRMINSTAR)
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);

if (min == 0)
  {
  /* Handles both invalid and empty cases. Since the minimum repeat,
  is zero the invalid case is basically the same as an empty case. */
  if (ref)
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    {
    compile_dnref_search(common, ccbegin, NULL);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  /* Length is non-zero, we can match real repeats. */
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
  jump = JUMP(SLJIT_JUMP);
  }
else
  {
  if (ref)
    {
    add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    }
  else
    {
    compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  }

BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();
if (max > 0)
  add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_GREATER_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, max));

if (!ref)
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(2));
compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, TRUE, TRUE);
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);

if (min > 1)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), TMP1, 0);
  CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, BACKTRACK_AS(ref_iterator_backtrack)->matchingpath);
  }
else if (max > 0)
  OP2(SLJIT_ADD, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 1);

if (jump != NULL)
  JUMPHERE(jump);
JUMPHERE(zerolength);

count_match(common);
return cc;
}